

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<ProjectBuilderSources>::Inserter::insertOne
          (Inserter *this,qsizetype pos,ProjectBuilderSources *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ProjectBuilderSources *pPVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  ProjectBuilderSources *pPVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  long lVar12;
  long lVar13;
  
  pPVar3 = this->begin;
  lVar12 = this->size;
  pPVar7 = pPVar3 + lVar12;
  this->end = pPVar7;
  this->last = pPVar3 + lVar12 + -1;
  this->where = pPVar3 + pos;
  lVar12 = lVar12 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar12;
  this->sourceCopyAssign = 1;
  if (lVar12 < 1) {
    this->sourceCopyConstruct = 1 - lVar12;
    this->move = 0;
    this->sourceCopyAssign = lVar12;
  }
  if (this->sourceCopyConstruct != 0) {
    bVar11 = t->object_output;
    pPVar7->buildable = t->buildable;
    pPVar7->object_output = bVar11;
    pDVar4 = (t->key).d.d;
    (t->key).d.d = (Data *)0x0;
    (pPVar7->key).d.d = pDVar4;
    pcVar5 = (t->key).d.ptr;
    (t->key).d.ptr = (char16_t *)0x0;
    (pPVar7->key).d.ptr = pcVar5;
    qVar6 = (t->key).d.size;
    (t->key).d.size = 0;
    (pPVar7->key).d.size = qVar6;
    pDVar4 = (t->group).d.d;
    (t->group).d.d = (Data *)0x0;
    (pPVar7->group).d.d = pDVar4;
    pcVar5 = (t->group).d.ptr;
    (t->group).d.ptr = (char16_t *)0x0;
    (pPVar7->group).d.ptr = pcVar5;
    qVar6 = (t->group).d.size;
    (t->group).d.size = 0;
    (pPVar7->group).d.size = qVar6;
    pDVar4 = (t->compiler).d.d;
    (t->compiler).d.d = (Data *)0x0;
    (pPVar7->compiler).d.d = pDVar4;
    pcVar5 = (t->compiler).d.ptr;
    (t->compiler).d.ptr = (char16_t *)0x0;
    (pPVar7->compiler).d.ptr = pcVar5;
    qVar6 = (t->compiler).d.size;
    (t->compiler).d.size = 0;
    (pPVar7->compiler).d.size = qVar6;
    this->size = this->size + 1;
    return;
  }
  bVar11 = pPVar7[-1].object_output;
  pPVar7->buildable = pPVar7[-1].buildable;
  pPVar7->object_output = bVar11;
  pDVar4 = pPVar7[-1].key.d.d;
  pcVar5 = pPVar7[-1].key.d.ptr;
  pPVar7[-1].key.d.d = (Data *)0x0;
  pPVar7[-1].key.d.ptr = (char16_t *)0x0;
  (pPVar7->key).d.d = pDVar4;
  (pPVar7->key).d.ptr = pcVar5;
  qVar6 = pPVar7[-1].key.d.size;
  pPVar7[-1].key.d.size = 0;
  (pPVar7->key).d.size = qVar6;
  pDVar4 = pPVar7[-1].group.d.d;
  pcVar5 = pPVar7[-1].group.d.ptr;
  pPVar7[-1].group.d.d = (Data *)0x0;
  pPVar7[-1].group.d.ptr = (char16_t *)0x0;
  (pPVar7->group).d.d = pDVar4;
  (pPVar7->group).d.ptr = pcVar5;
  qVar6 = pPVar7[-1].group.d.size;
  pPVar7[-1].group.d.size = 0;
  (pPVar7->group).d.size = qVar6;
  pDVar4 = pPVar7[-1].compiler.d.d;
  pcVar5 = pPVar7[-1].compiler.d.ptr;
  pPVar7[-1].compiler.d.d = (Data *)0x0;
  pPVar7[-1].compiler.d.ptr = (char16_t *)0x0;
  (pPVar7->compiler).d.d = pDVar4;
  (pPVar7->compiler).d.ptr = pcVar5;
  qVar6 = pPVar7[-1].compiler.d.size;
  pPVar7[-1].compiler.d.size = 0;
  (pPVar7->compiler).d.size = qVar6;
  this->size = this->size + 1;
  if (this->move != 0) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      pPVar7 = this->last;
      *(undefined2 *)(&pPVar7->buildable + lVar12) = *(undefined2 *)(&pPVar7[-1].buildable + lVar12)
      ;
      puVar1 = (undefined8 *)((long)&(pPVar7->key).d.d + lVar12);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)((long)pPVar7 + lVar12 + -0x48);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pPVar7->key).d.d + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar1 = (undefined8 *)((long)pPVar7 + lVar12 + -0x48);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      uVar8 = *(undefined8 *)((long)&(pPVar7->key).d.size + lVar12);
      *(undefined8 *)((long)&(pPVar7->key).d.size + lVar12) =
           *(undefined8 *)((long)pPVar7 + lVar12 + -0x38);
      *(undefined8 *)((long)pPVar7 + lVar12 + -0x38) = uVar8;
      puVar1 = (undefined8 *)((long)&(pPVar7->group).d.d + lVar12);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)((long)pPVar7 + lVar12 + -0x30);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pPVar7->group).d.d + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar1 = (undefined8 *)((long)pPVar7 + lVar12 + -0x30);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      uVar8 = *(undefined8 *)((long)&(pPVar7->group).d.size + lVar12);
      *(undefined8 *)((long)&(pPVar7->group).d.size + lVar12) =
           *(undefined8 *)((long)pPVar7 + lVar12 + -0x20);
      *(undefined8 *)((long)pPVar7 + lVar12 + -0x20) = uVar8;
      puVar1 = (undefined8 *)((long)pPVar7 + lVar12 + -0x18);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pPVar7->compiler).d.d + lVar12);
      uVar9 = *puVar2;
      uVar10 = puVar2[1];
      puVar2 = (undefined8 *)((long)&(pPVar7->compiler).d.d + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      puVar1 = (undefined8 *)((long)pPVar7 + lVar12 + -0x18);
      *puVar1 = uVar9;
      puVar1[1] = uVar10;
      uVar8 = *(undefined8 *)((long)&(pPVar7->compiler).d.size + lVar12);
      *(undefined8 *)((long)&(pPVar7->compiler).d.size + lVar12) =
           *(undefined8 *)((long)pPVar7 + lVar12 + -8);
      *(undefined8 *)((long)pPVar7 + lVar12 + -8) = uVar8;
      lVar13 = lVar13 + -1;
      lVar12 = lVar12 + -0x50;
    } while (lVar13 != this->move);
  }
  pPVar7 = this->where;
  bVar11 = t->object_output;
  pPVar7->buildable = t->buildable;
  pPVar7->object_output = bVar11;
  pDVar4 = (pPVar7->key).d.d;
  (pPVar7->key).d.d = (t->key).d.d;
  (t->key).d.d = pDVar4;
  pcVar5 = (pPVar7->key).d.ptr;
  (pPVar7->key).d.ptr = (t->key).d.ptr;
  (t->key).d.ptr = pcVar5;
  qVar6 = (pPVar7->key).d.size;
  (pPVar7->key).d.size = (t->key).d.size;
  (t->key).d.size = qVar6;
  pDVar4 = (pPVar7->group).d.d;
  (pPVar7->group).d.d = (t->group).d.d;
  (t->group).d.d = pDVar4;
  pcVar5 = (pPVar7->group).d.ptr;
  (pPVar7->group).d.ptr = (t->group).d.ptr;
  (t->group).d.ptr = pcVar5;
  qVar6 = (pPVar7->group).d.size;
  (pPVar7->group).d.size = (t->group).d.size;
  (t->group).d.size = qVar6;
  pDVar4 = (pPVar7->compiler).d.d;
  (pPVar7->compiler).d.d = (t->compiler).d.d;
  (t->compiler).d.d = pDVar4;
  pcVar5 = (pPVar7->compiler).d.ptr;
  (pPVar7->compiler).d.ptr = (t->compiler).d.ptr;
  (t->compiler).d.ptr = pcVar5;
  qVar6 = (pPVar7->compiler).d.size;
  (pPVar7->compiler).d.size = (t->compiler).d.size;
  (t->compiler).d.size = qVar6;
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }